

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

znzFile nifti_image_write_hdr_img2
                  (nifti_image *nim,int write_opts,char *opts,znzFile imgfile,nifti_brick_list *NBL)

{
  uint uVar1;
  char *__s1;
  int iVar2;
  znzFile pzVar3;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  znzFile file;
  nifti_brick_list *NBL_00;
  uint write_data;
  uint uVar8;
  ulong uVar9;
  char func [27];
  znzFile local_1d8;
  char **local_1d0;
  nifti_brick_list *local_1c8;
  char *local_1c0;
  uint local_1b4;
  znzFile local_1b0;
  char local_1a8 [28];
  nifti_1_header local_18c;
  
  builtin_strncpy(local_1a8 + 0x10,"e_hdr_img2",0xb);
  builtin_strncpy(local_1a8,"nifti_image_writ",0x10);
  local_1c0 = opts;
  if (nim == (nifti_image *)0x0) {
    nifti_image_write_hdr_img2_cold_9();
    return (znzFile)0x0;
  }
  iVar2 = nifti_validfilename(nim->fname);
  if (iVar2 == 0) {
    nifti_image_write_hdr_img2_cold_8();
    return (znzFile)0x0;
  }
  write_data = write_opts & 1;
  local_1b0 = imgfile;
  if (write_data != 0) {
    if (nim->data == (void *)0x0 && NBL == (nifti_brick_list *)0x0) {
      nifti_image_write_hdr_img2_cold_1();
      return (znzFile)0x0;
    }
    if (NBL != (nifti_brick_list *)0x0) {
      uVar1 = nim->ndim;
      if ((int)uVar1 < 1) {
        uVar9 = 0;
        uVar8 = 0;
      }
      else {
        uVar9 = (ulong)nim->nbyper;
        uVar6 = 2;
        if ((ulong)(uVar1 - 1) < 2) {
          uVar6 = (ulong)(uVar1 - 1);
        }
        lVar7 = 0;
        do {
          uVar9 = uVar9 * (long)nim->dim[lVar7 + 1];
          lVar7 = lVar7 + 1;
        } while (uVar6 + 1 != lVar7);
        uVar8 = 1;
        if (3 < (int)uVar1) {
          lVar7 = 0;
          do {
            uVar8 = uVar8 * nim->dim[lVar7 + 4];
            lVar7 = lVar7 + 1;
          } while ((ulong)uVar1 - 3 != lVar7);
        }
      }
      uVar6 = NBL->bsize;
      local_1b4 = write_data;
      if ((uVar9 != uVar6) && (1 < g_opts_0)) {
        fprintf(_stderr,"** NBL/nim mismatch, volbytes = %u, %u\n",uVar6 & 0xffffffff);
      }
      write_data = local_1b4;
      if (uVar8 != NBL->nbricks) {
        if (1 < g_opts_0) {
          fprintf(_stderr,"** NBL/nim mismatch, nvols = %d, %d\n",(ulong)(uint)NBL->nbricks,
                  (ulong)uVar8);
        }
LAB_00118bb2:
        nifti_image_write_hdr_img2_cold_2();
        return (znzFile)0x0;
      }
      if (uVar9 != uVar6) goto LAB_00118bb2;
      if (2 < g_opts_0) {
        fprintf(_stderr,"-- nim/NBL agree: nvols = %d, nbytes = %u\n",(ulong)uVar8);
      }
    }
  }
  local_1c8 = NBL;
  nifti_set_iname_offset(nim);
  if (1 < g_opts_0) {
    nifti_image_write_hdr_img2_cold_3();
  }
  iVar2 = nim->nifti_type;
  if (iVar2 == 3) {
    pzVar3 = nifti_write_ascii_image(nim,local_1c8,local_1c0,write_data,write_opts & 2U);
    return pzVar3;
  }
  local_1d0 = &nim->fname;
  nifti_convert_nim2nhdr(&local_18c,nim);
  if (iVar2 != 1) {
    pcVar4 = nim->fname;
    __s1 = nim->iname;
    if (__s1 != (char *)0x0) {
      iVar2 = strcmp(__s1,pcVar4);
      if (iVar2 != 0) goto LAB_00118992;
      free(__s1);
      nim->iname = (char *)0x0;
      pcVar4 = nim->fname;
      iVar2 = nim->nifti_type;
    }
    pcVar4 = nifti_makeimgname(pcVar4,iVar2,0,0);
    nim->iname = pcVar4;
    if (pcVar4 == (char *)0x0) {
      return (znzFile)0x0;
    }
  }
LAB_00118992:
  pzVar3 = local_1b0;
  if ((local_1b0 == (znzFile)0x0) || (nim->nifti_type != 1)) {
    pcVar4 = *local_1d0;
    if (2 < g_opts_0) {
      fprintf(_stderr,"+d opening output file %s [%s]\n",pcVar4,local_1c0);
      pcVar4 = *local_1d0;
    }
    iVar2 = nifti_is_gzfile(pcVar4);
    local_1d8 = znzopen(pcVar4,local_1c0,iVar2);
    file = local_1d8;
    if (local_1d8 == (znzFile)0x0) {
      fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",local_1a8,"cannot open output file",*local_1d0);
      return (znzFile)0x0;
    }
  }
  else {
    file = pzVar3;
    if (2 < g_opts_0) {
      nifti_image_write_hdr_img2_cold_4();
    }
  }
  local_1d8 = file;
  sVar5 = znzwrite(&local_18c,1,0x15c,file);
  if (sVar5 < 0x15c) {
    fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",local_1a8,"bad header write to output file",
            *local_1d0);
  }
  else {
    if (nim->nifti_type != 0) {
      nifti_write_extensions(file,nim);
    }
    if ((write_opts & 3U) != 0) {
      NBL_00 = local_1c8;
      if (nim->nifti_type != 1) {
        Xznzclose(&local_1d8);
        NBL_00 = local_1c8;
        if (pzVar3 == (znzFile)0x0) {
          if (2 < g_opts_0) {
            nifti_image_write_hdr_img2_cold_6();
          }
          pcVar4 = nim->iname;
          iVar2 = nifti_is_gzfile(pcVar4);
          local_1d8 = znzopen(pcVar4,local_1c0,iVar2);
          NBL_00 = local_1c8;
          if (local_1d8 == (znzFile)0x0) {
            fprintf(_stderr,"** ERROR: nifti_image_write_hdr_img: %s\n","cannot open image file");
            return local_1d8;
          }
        }
        else {
          if (2 < g_opts_0) {
            nifti_image_write_hdr_img2_cold_5();
          }
          local_1d8 = pzVar3;
        }
      }
      znzseek(local_1d8,(long)nim->iname_offset,0);
      if (write_data != 0) {
        nifti_write_all_data(local_1d8,nim,NBL_00);
      }
      if ((write_opts & 2U) == 0) {
        Xznzclose(&local_1d8);
        return local_1d8;
      }
      return local_1d8;
    }
    if (2 < g_opts_0) {
      nifti_image_write_hdr_img2_cold_7();
    }
  }
  Xznzclose(&local_1d8);
  return local_1d8;
}

Assistant:

znzFile nifti_image_write_hdr_img2(nifti_image *nim, int write_opts,
               const char * opts, znzFile imgfile, const nifti_brick_list * NBL)
{
   struct nifti_1_header nhdr ;
   znzFile               fp=NULL;
   size_t                ss ;
   int                   write_data, leave_open;
   char                  func[] = { "nifti_image_write_hdr_img2" };

   write_data = write_opts & 1;  /* just separate the bits now */
   leave_open = write_opts & 2;

   if( ! nim                              ) ERREX("NULL input") ;
   if( ! nifti_validfilename(nim->fname)  ) ERREX("bad fname input") ;
   if( write_data && ! nim->data && ! NBL ) ERREX("no image data") ;

   if( write_data && NBL && ! nifti_NBL_matches_nim(nim, NBL) )
      ERREX("NBL does not match nim");

   nifti_set_iname_offset(nim);

   if( g_opts.debug > 1 ){
      fprintf(stderr,"-d writing nifti file '%s'...\n", nim->fname);
      if( g_opts.debug > 2 )
         fprintf(stderr,"-d nifti type %d, offset %d\n",
                 nim->nifti_type, nim->iname_offset);
   }

   if( nim->nifti_type == NIFTI_FTYPE_ASCII )   /* non-standard case */
      return nifti_write_ascii_image(nim,NBL,opts,write_data,leave_open);

   nhdr = nifti_convert_nim2nhdr(nim);    /* create the nifti1_header struct */

   /* if writing to 2 files, make sure iname is set and different from fname */
   if( nim->nifti_type != NIFTI_FTYPE_NIFTI1_1 ){
       if( nim->iname && strcmp(nim->iname,nim->fname) == 0 ){
         free(nim->iname) ; nim->iname = NULL ;
       }
       if( nim->iname == NULL ){ /* then make a new one */
         nim->iname = nifti_makeimgname(nim->fname,nim->nifti_type,0,0);
         if( nim->iname == NULL ) return NULL;
       }
   }

   /* if we have an imgfile and will write the header there, use it */
   if( ! znz_isnull(imgfile) && nim->nifti_type == NIFTI_FTYPE_NIFTI1_1 ){
      if( g_opts.debug > 2 ) fprintf(stderr,"+d using passed file for hdr\n");
      fp = imgfile;
   }
   else {
      if( g_opts.debug > 2 )
         fprintf(stderr,"+d opening output file %s [%s]\n",nim->fname,opts);
      fp = znzopen( nim->fname , opts , nifti_is_gzfile(nim->fname) ) ;
      if( znz_isnull(fp) ){
         LNI_FERR(func,"cannot open output file",nim->fname);
         return fp;
      }
   }

   /* write the header and extensions */

   ss = znzwrite(&nhdr , 1 , sizeof(nhdr) , fp); /* write header */
   if( ss < sizeof(nhdr) ){
      LNI_FERR(func,"bad header write to output file",nim->fname);
      znzclose(fp); return fp;
   }

   /* partial file exists, and errors have been printed, so ignore return */
   if( nim->nifti_type != NIFTI_FTYPE_ANALYZE )
      (void)nifti_write_extensions(fp,nim);

   /* if the header is all we want, we are done */
   if( ! write_data && ! leave_open ){
      if( g_opts.debug > 2 ) fprintf(stderr,"-d header is all we want: done\n");
      znzclose(fp); return(fp);
   }

   if( nim->nifti_type != NIFTI_FTYPE_NIFTI1_1 ){ /* get a new file pointer */
      znzclose(fp);         /* first, close header file */
      if( ! znz_isnull(imgfile) ){
         if(g_opts.debug > 2) fprintf(stderr,"+d using passed file for img\n");
         fp = imgfile;
      }
      else {
         if( g_opts.debug > 2 )
            fprintf(stderr,"+d opening img file '%s'\n", nim->iname);
         fp = znzopen( nim->iname , opts , nifti_is_gzfile(nim->iname) ) ;
         if( znz_isnull(fp) ) ERREX("cannot open image file") ;
      }
   }

   znzseek(fp, nim->iname_offset, SEEK_SET);  /* in any case, seek to offset */

   if( write_data ) nifti_write_all_data(fp,nim,NBL);
   if( ! leave_open ) znzclose(fp);

   return fp;
}